

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O1

CallResultWrap * tapi_query_trades(void *h,char *account_id,char *codes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Trade *pTVar1;
  vector<TradeWrap*,std::allocator<TradeWrap*>> *this_00;
  iterator __position;
  element_type *peVar2;
  void *pvVar3;
  CallResultWrap *pCVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  TradeWrap *this_01;
  _WrapArray<TradeWrap> *__tmp;
  Trade *trade;
  CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_> r;
  allocator local_a2;
  allocator local_a1;
  TradeWrap *local_a0 [2];
  undefined1 local_90 [48];
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (h != (void *)0x0) {
    std::__cxx11::string::string((string *)local_a0,account_id,&local_a1);
    std::__cxx11::string::string((string *)local_50,codes,&local_a2);
    (**(code **)(*h + 0x38))(local_90 + 0x10,h,local_a0,local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (local_a0[0] != (TradeWrap *)local_90) {
      operator_delete(local_a0[0]);
    }
    pCVar4 = (CallResultWrap *)operator_new(0x10c);
    *(undefined8 *)((long)&pCVar4->value + 4) = 0;
    pCVar4->element_count = 0;
    pCVar4->value_type = 0;
    pCVar4->msg = (char *)0x0;
    pCVar4->value = (void *)0x0;
    (pCVar4->_msg)._M_dataplus._M_p = (pointer)&(pCVar4->_msg).field_2;
    (pCVar4->_msg)._M_string_length = 0;
    (pCVar4->_msg).field_2._M_local_buf[0] = '\0';
    (pCVar4->text)._M_dataplus._M_p = (pointer)&(pCVar4->text).field_2;
    (pCVar4->text)._M_string_length = 0;
    (pCVar4->text).field_2._M_local_buf[0] = '\0';
    memset(&pCVar4->bars,0,0xb0);
    if ((long *)local_90._16_8_ == (long *)0x0) {
      utf8_to_utf16((string *)(local_90 + 0x20),&pCVar4->_msg);
      pCVar4->msg = (pCVar4->_msg)._M_dataplus._M_p;
    }
    else {
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00168130;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      (pCVar4->trades).super___shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)(p_Var5 + 1);
      this = (pCVar4->trades).super___shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      (pCVar4->trades).super___shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      trade = *(Trade **)local_90._16_8_;
      pTVar1 = *(Trade **)(local_90._16_8_ + 8);
      if (trade != pTVar1) {
        do {
          this_00 = (vector<TradeWrap*,std::allocator<TradeWrap*>> *)
                    (pCVar4->trades).
                    super___shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (TradeWrap *)operator_new(0x10c);
          TradeWrap::TradeWrap(this_01,trade);
          __position._M_current = *(TradeWrap ***)(this_00 + 8);
          local_a0[0] = this_01;
          if (__position._M_current == *(TradeWrap ***)(this_00 + 0x10)) {
            std::vector<TradeWrap*,std::allocator<TradeWrap*>>::_M_realloc_insert<TradeWrap*>
                      (this_00,__position,local_a0);
          }
          else {
            *__position._M_current = this_01;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          trade = trade + 1;
        } while (trade != pTVar1);
      }
      peVar2 = (pCVar4->trades).
               super___shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pvVar3 = (peVar2->wraps).super__Vector_base<TradeWrap_*,_std::allocator<TradeWrap_*>_>._M_impl
               .super__Vector_impl_data._M_start;
      pCVar4->value = pvVar3;
      pCVar4->element_size = 0x10c;
      pCVar4->element_count =
           (int32_t)((ulong)((long)(peVar2->wraps).
                                   super__Vector_base<TradeWrap_*,_std::allocator<TradeWrap_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3);
      pCVar4->value_type = 9;
    }
    if ((char *)local_90._32_8_ != local_60) {
      operator_delete((void *)local_90._32_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._24_8_);
    }
    return pCVar4;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x154,"CallResultWrap *tapi_query_trades(void *, const char *, const char *)");
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_query_trades(void* h, const char* account_id, const char* codes)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->query_trades(account_id, codes);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
		cr->trades = make_shared<TradeWrapArray>();
        for (auto& tmp : *r.value)
            cr->trades->wraps.push_back(new TradeWrap(&tmp));

        cr->value = reinterpret_cast<const void*>(cr->trades->wraps.data());
        cr->element_size = sizeof(TradeWrap);
        cr->element_count = (int32_t)cr->trades->wraps.size();
        cr->value_type = VT_TRADE_ARRAY;
    }
    else {
		cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}